

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OddImageSizes.c
# Opt level: O1

void draw(IceTDouble *projection_matrix,IceTDouble *modelview_matrix,IceTFloat *background_color,
         IceTInt *readback_viewport,IceTImage result)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  IceTBoolean IVar4;
  int iVar5;
  IceTFloat *pIVar6;
  IceTUByte *pIVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  double *pdVar12;
  ulong uVar13;
  long lVar14;
  float fVar15;
  IceTFloat IVar16;
  double extraout_XMM0_Qa;
  double dVar17;
  double dVar18;
  double dVar19;
  IceTFloat IVar20;
  double dVar21;
  undefined4 uVar22;
  IceTFloat IVar23;
  undefined4 uVar24;
  IceTFloat IVar25;
  IceTFloat IVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  IceTInt screen_width;
  IceTInt screen_height;
  hexahedron transformed_box;
  IceTDouble inverse_transpose_transform [16];
  IceTDouble transform [16];
  int local_2f4;
  double local_2f0;
  int local_2e4;
  IceTFloat *local_2e0;
  double local_2d8;
  double local_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  double local_2b8 [24];
  IceTDouble local_1f8 [16];
  double local_178 [24];
  IceTDouble local_b8 [17];
  
  icetMatrixMultiply(local_b8,projection_matrix,modelview_matrix);
  IVar4 = icetMatrixInverseTranspose(local_b8,local_1f8);
  if (IVar4 == '\0') {
    puts("ERROR: Inverse failed.");
  }
  lVar14 = 0;
  do {
    icetMatrixVectorMultiply
              ((IceTDouble *)((long)local_2b8 + lVar14),local_1f8,
               (IceTDouble *)((long)unit_box.planes[0] + lVar14));
    lVar14 = lVar14 + 0x20;
  } while (lVar14 != 0xc0);
  icetGetIntegerv(7,&local_2f4);
  icetGetIntegerv(8,&local_2e4);
  if (g_transparent == '\x01') {
    pIVar6 = icetImageGetColorf(result);
    local_2e0 = (IceTFloat *)0x0;
    pIVar7 = (IceTUByte *)0x0;
  }
  else {
    pIVar7 = icetImageGetColorub(result);
    local_2e0 = icetImageGetDepthf(result);
    pIVar6 = (IceTFloat *)0x0;
  }
  if (0 < readback_viewport[3]) {
    iVar11 = readback_viewport[1];
    do {
      if (0 < readback_viewport[2]) {
        lVar14 = (long)*readback_viewport;
        local_2d0 = ((double)iVar11 + (double)iVar11) / (double)local_2e4 + -1.0;
        do {
          dVar21 = (double)(int)lVar14;
          local_2f0 = (dVar21 + dVar21) / (double)local_2f4 + -1.0;
          memcpy(local_178,local_2b8,0xc0);
          dVar29 = 0.0;
          uVar8 = 0xffffffff;
          pdVar12 = local_178 + 3;
          dVar28 = 2.0;
          uVar13 = 0;
          dVar21 = extraout_XMM0_Qa;
          do {
            iVar5 = (int)uVar8;
            dVar27 = ((pdVar12[-3] * local_2f0 + local_2d0 * pdVar12[-2]) - pdVar12[-1]) + *pdVar12;
            dVar17 = -dVar27;
            dVar19 = pdVar12[-3] * 0.0 + pdVar12[-2] * 0.0 + pdVar12[-1];
            bVar1 = NAN(dVar19);
            bVar2 = dVar19 != 0.0;
            dVar18 = dVar17 / dVar19;
            if ((!bVar2) && (!bVar1)) {
              dVar18 = dVar21;
            }
            bVar3 = dVar17 < dVar27;
            if (bVar2) {
              bVar3 = dVar19 < 0.0;
            }
            if (bVar1) {
              bVar3 = dVar19 < 0.0;
            }
            if ((bVar2) || (bVar1)) {
              if (bVar3) {
                if (dVar29 < dVar18) {
                  uVar8 = uVar13 & 0xffffffff;
                  dVar29 = dVar18;
                }
              }
              else if (dVar18 < dVar28) {
                dVar28 = dVar18;
              }
            }
            else if (bVar3) {
              bVar1 = true;
              goto LAB_00108741;
            }
            iVar5 = (int)uVar8;
            uVar13 = uVar13 + 1;
            pdVar12 = pdVar12 + 4;
            dVar21 = dVar18;
          } while (uVar13 != 6);
          bVar1 = dVar28 <= dVar29;
LAB_00108741:
          if (bVar1) {
            IVar25 = *background_color;
            IVar23 = background_color[1];
            IVar16 = background_color[2];
            IVar26 = 1.0;
            IVar20 = background_color[3];
          }
          else {
            lVar9 = (long)iVar5;
            dVar21 = local_2b8[lVar9 * 4 + 2];
            dVar19 = dVar21 * dVar21 +
                     local_2b8[lVar9 * 4] * local_2b8[lVar9 * 4] +
                     local_2b8[lVar9 * 4 + 1] * local_2b8[lVar9 * 4 + 1];
            if (dVar19 < 0.0) {
              uStack_2c0 = 0;
              local_2f0 = dVar28;
              local_2d8 = dVar29;
              local_2c8 = dVar21;
              dVar19 = sqrt(dVar19);
              uVar22 = (undefined4)local_2c8;
              uVar24 = local_2c8._4_4_;
              dVar28 = local_2f0;
              dVar29 = local_2d8;
            }
            else {
              dVar19 = SQRT(dVar19);
              uVar22 = SUB84(dVar21,0);
              uVar24 = (int)((ulong)dVar21 >> 0x20);
            }
            fVar15 = (float)(-(double)CONCAT44(uVar24,uVar22) / dVar19);
            IVar25 = (IceTFloat)(g_color[0] * fVar15);
            IVar23 = (IceTFloat)(g_color[1] * fVar15);
            IVar16 = (IceTFloat)(fVar15 * g_color[2]);
            IVar26 = (IceTFloat)(float)(dVar29 * 0.5);
            IVar20 = (IceTFloat)g_color[3];
            if (g_transparent == '\x01') {
              dVar21 = (dVar28 - dVar29) * 4.0;
              lVar9 = (long)(int)(dVar21 * 1024.0);
              if (4.0 <= dVar21) {
                lVar9 = 0x1000;
              }
              fVar15 = (float)(double)g_opacity_lookup[lVar9];
              IVar25 = (IceTFloat)((float)IVar25 * fVar15);
              IVar23 = (IceTFloat)((float)IVar23 * fVar15);
              IVar16 = (IceTFloat)((float)IVar16 * fVar15);
              IVar20 = (IceTFloat)(g_color[3] * fVar15);
            }
          }
          lVar9 = (long)((int)((long)local_2f4 * (long)iVar11) + (int)lVar14);
          lVar10 = lVar9 * 4;
          if (g_transparent == '\x01') {
            pIVar6[lVar9 * 4] = IVar25;
            pIVar6[lVar9 * 4 + 1] = IVar23;
            pIVar6[lVar9 * 4 + 2] = IVar16;
            pIVar6[lVar9 * 4 + 3] = IVar20;
          }
          else {
            pIVar7[lVar10] = (IceTUByte)(int)((float)IVar25 * 255.0);
            pIVar7[lVar10 + 1] = (IceTUByte)(int)((float)IVar23 * 255.0);
            pIVar7[lVar10 + 2] = (IceTUByte)(int)((float)IVar16 * 255.0);
            pIVar7[lVar10 + 3] = (IceTUByte)(int)((float)IVar20 * 255.0);
            local_2e0[(long)local_2f4 * (long)iVar11 + lVar14] = IVar26;
          }
          lVar14 = lVar14 + 1;
        } while (lVar14 < (long)readback_viewport[2] + (long)*readback_viewport);
      }
      iVar11 = iVar11 + 1;
    } while (iVar11 < readback_viewport[3] + readback_viewport[1]);
  }
  if (g_first_render == '\x01') {
    if (g_sync_render == '\x01') {
      icetCommBarrier();
    }
    g_first_render = '\0';
  }
  return;
}

Assistant:

static void draw(const IceTDouble *projection_matrix,
                 const IceTDouble *modelview_matrix,
                 const IceTFloat *background_color,
                 const IceTInt *readback_viewport,
                 IceTImage result)
{
    IceTUByte *color_buffer;
    IceTFloat *depth_buffer;
    IceTSizeType num_pixels;
    IceTSizeType i;

    /* Suppress compiler warnings. */
    (void)projection_matrix;
    (void)modelview_matrix;
    (void)background_color;
    (void)readback_viewport;

    num_pixels = icetImageGetNumPixels(result);

    color_buffer = icetImageGetColorub(result);
    for (i = 0; i < num_pixels*4; i++) {
        color_buffer[i] = 255;
    }

    depth_buffer = icetImageGetDepthf(result);
    for (i = 0; i < num_pixels; i++) {
        depth_buffer[i] = 0.5f;
    }
}